

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voxelizer.h
# Opt level: O1

float vx__triangle_area(vx_triangle_t *triangle)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  fVar4 = (triangle->p1).field_0.v[0];
  fVar1 = (triangle->p1).field_0.v[1];
  fVar3 = (triangle->p2).field_0.v[0] - fVar4;
  fVar5 = (triangle->p2).field_0.v[1] - fVar1;
  fVar7 = (triangle->p1).field_0.v[2];
  fVar2 = (triangle->p2).field_0.v[2] - fVar7;
  fVar4 = (triangle->p3).field_0.v[0] - fVar4;
  fVar1 = (triangle->p3).field_0.v[1] - fVar1;
  fVar7 = (triangle->p3).field_0.v[2] - fVar7;
  fVar6 = fVar5 * fVar7 - fVar1 * fVar2;
  fVar7 = fVar2 * fVar4 - fVar7 * fVar3;
  fVar4 = fVar1 * fVar3 - fVar4 * fVar5;
  fVar4 = fVar4 * fVar4 + fVar7 * fVar7 + fVar6 * fVar6;
  if (fVar4 < 0.0) {
    fVar4 = sqrtf(fVar4);
  }
  else {
    fVar4 = SQRT(fVar4);
  }
  return fVar4 * 0.5;
}

Assistant:

float vx__triangle_area(vx_triangle_t* triangle) {
    vx_vertex_t ab = triangle->p2;
    vx_vertex_t ac = triangle->p3;

    vx__vertex_sub(&ab, &triangle->p1);
    vx__vertex_sub(&ac, &triangle->p1);

    float a0 = ab.y * ac.z - ab.z * ac.y;
    float a1 = ab.z * ac.x - ab.x * ac.z;
    float a2 = ab.x * ac.y - ab.y * ac.x;

    return sqrtf(powf(a0, 2.f) + powf(a1, 2.f) + powf(a2, 2.f)) * 0.5f;
}